

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_DescriptorSetOptionRetentionOverride_Test::
~CommandLineInterfaceTest_DescriptorSetOptionRetentionOverride_Test
          (CommandLineInterfaceTest_DescriptorSetOptionRetentionOverride_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, DescriptorSetOptionRetentionOverride) {
  // clang-format off
  CreateTempFile(
      "foo.proto",
      absl::Substitute(R"pb(
          syntax = "proto2";
          import "$0";
          extend google.protobuf.FileOptions {
            optional int32 runtime_retention_option = 50001
                [retention = RETENTION_RUNTIME];
            optional int32 source_retention_option = 50002
                [retention = RETENTION_SOURCE];
          }
          option (runtime_retention_option) = 2;
          option (source_retention_option) = 3;)pb",
          DescriptorProto::descriptor()->file()->name()));
  // clang-format on
  std::string descriptor_proto_base_dir = "src";
  Run(absl::Substitute(
      "protocol_compiler --descriptor_set_out=$$tmpdir/descriptor_set "
      "--proto_path=$$tmpdir --retain_options --proto_path=$0 foo.proto",
      descriptor_proto_base_dir));
  ExpectNoErrors();

  FileDescriptorSet descriptor_set;
  ReadDescriptorSet("descriptor_set", &descriptor_set);
  ASSERT_EQ(descriptor_set.file_size(), 1);
  const UnknownFieldSet& unknown_fields =
      descriptor_set.file(0).options().unknown_fields();

  // We expect all options to be present.
  ASSERT_EQ(unknown_fields.field_count(), 2);
  EXPECT_EQ(unknown_fields.field(0).number(), 50001);
  EXPECT_EQ(unknown_fields.field(1).number(), 50002);
  EXPECT_EQ(unknown_fields.field(0).varint(), 2);
  EXPECT_EQ(unknown_fields.field(1).varint(), 3);
}